

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O1

c_v256 * c_v256_pshuffle_8(c_v256 a,c_v256 pattern)

{
  undefined1 auVar1 [16];
  c_v128 cVar2;
  c_v128 cVar3;
  c_v256 *in_RDI;
  uint64_t local_18;
  uint64_t uStack_10;
  
  local_18 = a.u64[2];
  uStack_10 = a.u64[3];
  auVar1 = vpinsrb_avx(ZEXT116(*(byte *)((long)&local_18 + (ulong)(pattern.u32[4] & 0xf))),
                       (uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x11] & 0xf)),1);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x12] & 0xf)),2);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x13] & 0xf)),3);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x14] & 0xf)),4);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x15] & 0xf)),5);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x16] & 0xf)),6);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x17] & 0xf)),7);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x10] & 0xf)),8);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x11] & 0xf)),9);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x12] & 0xf)),10)
  ;
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x13] & 0xf)),0xb
                      );
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x14] & 0xf)),0xc
                      );
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x15] & 0xf)),0xd
                      );
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0x16] & 0xf)),0xe
                      );
  cVar2 = (c_v128)vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 +
                                                    (ulong)(pattern.u8[0x17] & 0xf)),0xf);
  local_18 = a.u64[0];
  uStack_10 = a.u64[1];
  auVar1 = vpinsrb_avx(ZEXT116(*(byte *)((long)&local_18 + (ulong)(pattern.u32[0] & 0xf))),
                       (uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[1] & 0xf)),1);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[2] & 0xf)),2);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[3] & 0xf)),3);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[4] & 0xf)),4);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[5] & 0xf)),5);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[6] & 0xf)),6);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[7] & 0xf)),7);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[0] & 0xf)),8);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[1] & 0xf)),9);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[2] & 0xf)),10);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[3] & 0xf)),0xb);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[4] & 0xf)),0xc);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[5] & 0xf)),0xd);
  auVar1 = vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[6] & 0xf)),0xe);
  cVar3 = (c_v128)vpinsrb_avx(auVar1,(uint)*(byte *)((long)&local_18 + (ulong)(pattern.u8[7] & 0xf))
                              ,0xf);
  in_RDI->v128[1] = cVar2;
  in_RDI->v128[0] = cVar3;
  return in_RDI;
}

Assistant:

SIMD_INLINE c_v256 c_v256_pshuffle_8(c_v256 a, c_v256 pattern) {
  return c_v256_from_v128(
      c_v128_shuffle_8(c_v256_high_v128(a), c_v256_high_v128(pattern)),
      c_v128_shuffle_8(c_v256_low_v128(a), c_v256_low_v128(pattern)));
}